

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O1

bool __thiscall
IRT::LabelPattern::TryToGenerateCode
          (LabelPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CLabelStatement *this_00;
  undefined1 local_69;
  shared_ptr<AssemblyCode::LabelCommand> local_68;
  string local_58;
  CLabel local_38;
  
  if (tree == (INode *)0x0) {
    this_00 = (CLabelStatement *)0x0;
  }
  else {
    this_00 = (CLabelStatement *)__dynamic_cast(tree,&INode::typeinfo,&CLabelStatement::typeinfo,0);
  }
  if (this_00 != (CLabelStatement *)0x0) {
    CLabelStatement::Label(&local_38,this_00);
    CLabel::ToString_abi_cxx11_(&local_58,&local_38);
    local_68.super___shared_ptr<AssemblyCode::LabelCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<AssemblyCode::LabelCommand,std::allocator<AssemblyCode::LabelCommand>,std::__cxx11::string>
              (&local_68.super___shared_ptr<AssemblyCode::LabelCommand,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(LabelCommand **)&local_68,
               (allocator<AssemblyCode::LabelCommand> *)&local_69,&local_58);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
    ::emplace_back<std::shared_ptr<AssemblyCode::LabelCommand>>
              ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                *)commands,&local_68);
    if (local_68.super___shared_ptr<AssemblyCode::LabelCommand,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<AssemblyCode::LabelCommand,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.label._M_dataplus._M_p != &local_38.label.field_2) {
      operator_delete(local_38.label._M_dataplus._M_p);
    }
  }
  return this_00 != (CLabelStatement *)0x0;
}

Assistant:

bool IRT::LabelPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                           AssemblyCommands &commands ) {
    ConstLabelPtr labelPtr = dynamic_cast<ConstLabelPtr>(tree);
    if ( labelPtr ) {
        commands.emplace_back( std::make_shared<AssemblyCode::LabelCommand>( labelPtr->Label( ).ToString( )));
        return true;
    }
    return false;
}